

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_dce.c
# Opt level: O1

void lj_opt_dce(jit_State *J)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  SnapShot *pSVar5;
  SnapEntry *pSVar6;
  IRIns *pIVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  IRRef ref;
  long alStack_328 [101];
  
  if ((J->flags & 0x40000) != 0) {
    uVar9 = (ulong)(J->cur).nsnap;
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        pSVar5 = (J->cur).snap;
        uVar12 = (ulong)pSVar5[uVar10].nent;
        if (uVar12 != 0) {
          uVar8 = pSVar5[uVar10].mapofs;
          pSVar6 = (J->cur).snapmap;
          uVar13 = 0;
          do {
            uVar4 = (ushort)pSVar6[uVar8 + uVar13];
            if (0x8000 < uVar4) {
              pbVar1 = (byte *)((long)(J->cur).ir + (ulong)uVar4 * 8 + 4);
              *pbVar1 = *pbVar1 | 0x20;
            }
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
    }
    lVar11 = 0;
    do {
      *(long *)((long)alStack_328 + lVar11 * 4) = (long)J->chain + lVar11;
      lVar11 = lVar11 + 2;
    } while (lVar11 != 0xca);
    uVar8 = (J->cur).nins - 1;
    if (0x8000 < uVar8) {
      lVar11 = (ulong)uVar8 * 8 + 6;
      do {
        pIVar7 = (J->cur).ir;
        bVar2 = *(byte *)((long)pIVar7 + lVar11 + -2);
        if ((bVar2 & 0x20) == 0) {
          bVar3 = *(byte *)((long)pIVar7 + lVar11 + -1);
          if (0x5f < ((bVar2 | 0x60) & lj_ir_mode[bVar3])) goto LAB_0014c904;
          *(undefined2 *)alStack_328[bVar3] = *(undefined2 *)((long)pIVar7 + lVar11);
          *(undefined8 *)((long)pIVar7 + lVar11 + -6) = 0xc0000000000;
        }
        else {
          *(byte *)((long)pIVar7 + lVar11 + -2) = bVar2 & 0xdf;
LAB_0014c904:
          alStack_328[*(byte *)((long)pIVar7 + lVar11 + -1)] = (long)pIVar7 + lVar11;
          uVar9 = (ulong)*(ushort *)((long)pIVar7 + lVar11 + -6);
          if (0x8000 < uVar9) {
            pbVar1 = (byte *)((long)(J->cur).ir + uVar9 * 8 + 4);
            *pbVar1 = *pbVar1 | 0x20;
          }
          uVar9 = (ulong)*(ushort *)((long)pIVar7 + lVar11 + -4);
          if (0x8000 < uVar9) {
            pbVar1 = (byte *)((long)(J->cur).ir + uVar9 * 8 + 4);
            *pbVar1 = *pbVar1 | 0x20;
          }
        }
        uVar8 = uVar8 - 1;
        lVar11 = lVar11 + -8;
      } while (0x8000 < uVar8);
    }
    J->bpropcache[0xe].key = 0;
    J->bpropcache[0xe].val = 0;
    J->bpropcache[0xe].mode = 0;
    J->bpropcache[0xf].key = 0;
    J->bpropcache[0xf].val = 0;
    J->bpropcache[0xf].mode = 0;
    J->bpropcache[0xc].key = 0;
    J->bpropcache[0xc].val = 0;
    J->bpropcache[0xc].mode = 0;
    J->bpropcache[0xd].key = 0;
    J->bpropcache[0xd].val = 0;
    J->bpropcache[0xd].mode = 0;
    J->bpropcache[10].key = 0;
    J->bpropcache[10].val = 0;
    J->bpropcache[10].mode = 0;
    J->bpropcache[0xb].key = 0;
    J->bpropcache[0xb].val = 0;
    J->bpropcache[0xb].mode = 0;
    J->bpropcache[8].key = 0;
    J->bpropcache[8].val = 0;
    J->bpropcache[8].mode = 0;
    J->bpropcache[9].key = 0;
    J->bpropcache[9].val = 0;
    J->bpropcache[9].mode = 0;
    J->bpropcache[6].key = 0;
    J->bpropcache[6].val = 0;
    J->bpropcache[6].mode = 0;
    J->bpropcache[7].key = 0;
    J->bpropcache[7].val = 0;
    J->bpropcache[7].mode = 0;
    J->bpropcache[4].key = 0;
    J->bpropcache[4].val = 0;
    J->bpropcache[4].mode = 0;
    J->bpropcache[5].key = 0;
    J->bpropcache[5].val = 0;
    J->bpropcache[5].mode = 0;
    J->bpropcache[2].key = 0;
    J->bpropcache[2].val = 0;
    J->bpropcache[2].mode = 0;
    J->bpropcache[3].key = 0;
    J->bpropcache[3].val = 0;
    J->bpropcache[3].mode = 0;
    J->bpropcache[0].key = 0;
    J->bpropcache[0].val = 0;
    J->bpropcache[0].mode = 0;
    J->bpropcache[1].key = 0;
    J->bpropcache[1].val = 0;
    J->bpropcache[1].mode = 0;
  }
  return;
}

Assistant:

void lj_opt_dce(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_DCE)) {
    dce_marksnap(J);
    dce_propagate(J);
    memset(J->bpropcache, 0, sizeof(J->bpropcache));  /* Invalidate cache. */
  }
}